

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O0

void serialization::
     unserialize_unpack<char_const*const*&,serialization::json_iarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>&>
               (char ***arg,json_iarchive *ar,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *front)

{
  char *key_00;
  char *key;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *pvStack_20;
  serialization_trace trace;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *front_local;
  json_iarchive *ar_local;
  char ***arg_local;
  
  key._0_4_ = 0x39;
  pvStack_20 = front;
  serialization_trace::serialization_trace<char_const(&)[19],char_const(&)[140],int>
            ((serialization_trace *)((long)&key + 7),(char (*) [19])"unserialize_unpack",
             (char (*) [140])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/serialization_unpack.h"
             ,(int *)&key);
  key_00 = **arg;
  json_iarchive::load_key_start(ar,key_00);
  unserialize_helper<serialization::json_iarchive,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            (ar,pvStack_20);
  json_iarchive::load_key_end(ar,key_00);
  *arg = *arg + 1;
  unserialize_unpack<char_const*const*&,serialization::json_iarchive>(arg,ar);
  return;
}

Assistant:

inline void unserialize_unpack(Argument && arg, const Archive & ar, T && front, Args&& ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.load_key_start(key);
    unserialize_helper(ar, front);
    ar.load_key_end(key);

    unserialize_unpack(++arg, ar, std::forward<Args>(next)...);
}